

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_type(lua_State *L)

{
  TValue *pTVar1;
  char *s;
  
  luaL_checkany(L,1);
  pTVar1 = L->base;
  s = "no value";
  if (((pTVar1 != &luaO_nilobject_) && (pTVar1 < L->top)) && ((long)pTVar1->tt != -1)) {
    s = luaT_typenames[pTVar1->tt];
  }
  lua_pushstring(L,s);
  return 1;
}

Assistant:

static int luaB_type(lua_State*L){
luaL_checkany(L,1);
lua_pushstring(L,luaL_typename(L,1));
return 1;
}